

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

void __thiscall dgList<dgConvexHull3DFace>::dgListNode::Unlink(dgListNode *this)

{
  dgListNode *pdVar1;
  dgListNode *pdVar2;
  
  pdVar1 = this->m_next;
  pdVar2 = this->m_prev;
  if (pdVar2 != (dgListNode *)0x0) {
    pdVar2->m_next = pdVar1;
  }
  if (pdVar1 != (dgListNode *)0x0) {
    pdVar1->m_prev = pdVar2;
  }
  this->m_next = (dgListNode *)0x0;
  this->m_prev = (dgListNode *)0x0;
  return;
}

Assistant:

void Unlink ()
		{
			if (m_prev) {
				m_prev->m_next = m_next;
			}

			if (m_next) {
				m_next->m_prev = m_prev;
			}
			m_prev = NULL;
			m_next = NULL;
		}